

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builder.cpp
# Opt level: O3

BaseNode * __thiscall asmjit::v1_14::BaseBuilder::addNode(BaseBuilder *this,BaseNode *node)

{
  BaseNode *pBVar1;
  NodeList *pNVar2;
  undefined8 *puVar3;
  long lVar4;
  long *plVar5;
  NodeList *pNVar6;
  long extraout_RDX;
  long *extraout_RDX_00;
  long *plVar7;
  undefined8 *puVar8;
  BaseNode *pBVar9;
  
  if (*(long *)node == 0) {
    if (*(long *)(node + 8) != 0) goto LAB_0011687f;
    if (-1 < (char)node[0x11]) {
      pBVar1 = this->_cursor;
      if (pBVar1 == (BaseNode *)0x0) {
        if (*(long *)&this->_nodeList == 0) {
          *(BaseNode **)&this->_nodeList = node;
          pNVar6 = (NodeList *)&this->field_0x1a8;
        }
        else {
          *(long *)(node + 8) = *(long *)&this->_nodeList;
          **(undefined8 **)&this->_nodeList = node;
          pNVar6 = &this->_nodeList;
        }
      }
      else {
        pNVar2 = *(NodeList **)(pBVar1 + 8);
        *(BaseNode **)node = pBVar1;
        *(NodeList **)(node + 8) = pNVar2;
        *(BaseNode **)(pBVar1 + 8) = node;
        pNVar6 = (NodeList *)&this->field_0x1a8;
        if (pNVar2 != (NodeList *)0x0) {
          pNVar6 = pNVar2;
        }
      }
      *(BaseNode **)pNVar6 = node;
      node[0x11] = (BaseNode)((byte)node[0x11] | 0x80);
      if (node[0x10] == (BaseNode)0x2) {
        this->_dirtySectionLinks = true;
      }
      this->_cursor = node;
      return node;
    }
  }
  else {
    addNode();
LAB_0011687f:
    addNode();
  }
  addNode();
  if (*(long *)node == 0) {
    if (*(long *)(node + 8) == 0) {
      puVar3 = *(undefined8 **)(extraout_RDX + 8);
      *(long *)node = extraout_RDX;
      *(undefined8 **)(node + 8) = puVar3;
      node[0x11] = (BaseNode)((byte)node[0x11] | 0x80);
      if (node[0x10] == (BaseNode)0x2) {
        this->_dirtySectionLinks = true;
      }
      *(BaseNode **)(extraout_RDX + 8) = node;
      puVar8 = (undefined8 *)&this->field_0x1a8;
      if (puVar3 != (undefined8 *)0x0) {
        puVar8 = puVar3;
      }
      *puVar8 = node;
      return node;
    }
  }
  else {
    addAfter();
  }
  addAfter();
  if (*(long *)node == 0) {
    if (*(long *)(node + 8) != 0) goto LAB_00116932;
    if (-1 < (char)node[0x11]) {
      if (*(char *)((long)extraout_RDX_00 + 0x11) < '\0') {
        lVar4 = *extraout_RDX_00;
        *(long *)node = lVar4;
        *(long **)(node + 8) = extraout_RDX_00;
        node[0x11] = (BaseNode)((byte)node[0x11] | 0x80);
        if (node[0x10] == (BaseNode)0x2) {
          this->_dirtySectionLinks = true;
        }
        *extraout_RDX_00 = (long)node;
        pNVar6 = (NodeList *)(lVar4 + 8);
        if (lVar4 == 0) {
          pNVar6 = &this->_nodeList;
        }
        *(BaseNode **)pNVar6 = node;
        return node;
      }
      goto LAB_0011693c;
    }
  }
  else {
    addBefore();
LAB_00116932:
    addBefore();
  }
  addBefore();
LAB_0011693c:
  addBefore();
  if ((char)node[0x11] < '\0') {
    pBVar1 = *(BaseNode **)node;
    plVar5 = *(long **)(node + 8);
    pBVar9 = pBVar1 + 8;
    if (*(BaseNode **)&this->_nodeList == node) {
      pBVar9 = (BaseNode *)&this->_nodeList;
    }
    *(long **)pBVar9 = plVar5;
    plVar7 = (long *)&this->field_0x1a8;
    if (*(BaseNode **)&this->field_0x1a8 != node) {
      plVar7 = plVar5;
    }
    *plVar7 = (long)pBVar1;
    *(long *)node = 0;
    *(long *)(node + 8) = 0;
    node[0x11] = (BaseNode)((byte)node[0x11] & 0x7f);
    if (node[0x10] == (BaseNode)0x2) {
      this->_dirtySectionLinks = true;
    }
    if (this->_cursor == node) {
      this->_cursor = pBVar1;
      return node;
    }
  }
  return node;
}

Assistant:

BaseNode* BaseBuilder::addNode(BaseNode* node) noexcept {
  ASMJIT_ASSERT(!node->_prev);
  ASMJIT_ASSERT(!node->_next);
  ASMJIT_ASSERT(!node->isActive());

  if (!_cursor) {
    if (_nodeList.empty()) {
      _nodeList.reset(node, node);
    }
    else {
      node->_next = _nodeList.first();
      _nodeList._first->_prev = node;
      _nodeList._first = node;
    }
  }
  else {
    BaseNode* prev = _cursor;
    BaseNode* next = _cursor->next();

    node->_prev = prev;
    node->_next = next;

    prev->_next = node;
    if (next)
      next->_prev = node;
    else
      _nodeList._last = node;
  }

  node->addFlags(NodeFlags::kIsActive);
  if (node->isSection())
    _dirtySectionLinks = true;

  _cursor = node;
  return node;
}